

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e handle_wait_io_receive_msg(pcp_server_t *s)

{
  uint32_t uVar1;
  pcp_ctx_t *ppVar2;
  pcp_server_state_e pVar3;
  uint uVar4;
  pcp_flow_t *ppVar5;
  uint uVar6;
  
  ppVar2 = s->ctx;
  pcp_logger(PCP_LOGLVL_INFO,
             "Received PCP packet from server at %s, size %d, result_code %d, epoch %d",
             s->pcp_server_paddr,(ulong)(ppVar2->msg).pcp_msg_len,(ulong)(ppVar2->msg).recv_result,
             (ulong)(ppVar2->msg).recv_epoch);
  uVar1 = (ppVar2->msg).recv_result;
  if (uVar1 == 0xc) {
    pcp_logger(PCP_LOGLVL_WARN,
               "There is PCP-unaware NAT present between client and PCP server %s. Sending of PCP messages was disabled."
               ,s->pcp_server_paddr);
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    pVar3 = pss_set_not_working;
  }
  else if (uVar1 == 1) {
    gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
    s->next_version = (uint8_t)(ppVar2->msg).recv_version;
    pVar3 = pss_version_negotiation;
  }
  else {
    ppVar5 = server_process_rcvd_pcp_msg(s,&ppVar2->msg);
    if (s->epoch == 0xffffffff) {
      s->epoch = (ppVar2->msg).recv_epoch;
      s->cepoch = (ppVar2->msg).received_time;
    }
    uVar6 = (int)(ppVar2->msg).received_time - (int)s->cepoch;
    uVar4 = (ppVar2->msg).recv_epoch - s->epoch;
    if ((uVar6 + 2 < uVar4 - (uVar4 >> 4)) || (uVar4 + 2 < uVar6 - (uVar6 >> 4))) {
      s->epoch = (ppVar2->msg).recv_epoch;
      s->cepoch = (ppVar2->msg).received_time;
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
      s->restart_flow_msg = ppVar5;
      pVar3 = pss_server_restart;
    }
    else {
      gettimeofday((timeval *)&s->next_timeout,(__timezone_ptr_t)0x0);
      pVar3 = pss_wait_io_calc_nearest_timeout;
    }
  }
  return pVar3;
}

Assistant:

static pcp_server_state_e handle_wait_io_receive_msg(pcp_server_t *s) {
    pcp_recv_msg_t *msg = &s->ctx->msg;
    pcp_flow_t *f;

    PCP_LOG(PCP_LOGLVL_INFO,
            "Received PCP packet from server at %s, size %d, result_code %d, "
            "epoch %d",
            s->pcp_server_paddr, msg->pcp_msg_len, msg->recv_result,
            msg->recv_epoch);

    switch (msg->recv_result) {
    case PCP_RES_UNSUPP_VERSION:
        PCP_LOG(PCP_LOGLVL_DEBUG,
                "PCP server %s returned "
                "result_code=Unsupported version",
                s->pcp_server_paddr);
        gettimeofday(&s->next_timeout, NULL);
        s->next_version = msg->recv_version;
        return pss_version_negotiation;
    case PCP_RES_ADDRESS_MISMATCH:
        PCP_LOG(PCP_LOGLVL_WARN,
                "There is PCP-unaware NAT present "
                "between client and PCP server %s. "
                "Sending of PCP messages was disabled.",
                s->pcp_server_paddr);
        gettimeofday(&s->next_timeout, NULL);
        return pss_set_not_working;
    }

    f = server_process_rcvd_pcp_msg(s, msg);

    if (compare_epochs(msg, s)) {
        s->epoch = msg->recv_epoch;
        s->cepoch = msg->received_time;
        gettimeofday(&s->next_timeout, NULL);
        s->restart_flow_msg = f;

        return pss_server_restart;
    }

    gettimeofday(&s->next_timeout, NULL);

    return pss_wait_io_calc_nearest_timeout;
}